

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O3

REF_STATUS ref_import_su2(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_DBL *pRVar1;
  REF_NODE ref_node;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  FILE *__stream;
  char *pcVar6;
  long lVar7;
  REF_DBL *pRVar8;
  undefined8 uVar9;
  ulong uVar10;
  char *pcVar11;
  undefined8 uVar12;
  REF_GRID_conflict pRVar13;
  REF_DBL RVar14;
  REF_INT cell_type;
  REF_INT new_cell;
  REF_INT new_node;
  REF_DBL y;
  REF_DBL x;
  REF_DBL z;
  char line [1024];
  int local_4ec;
  REF_INT local_4e8;
  uint local_4e4;
  uint local_4e0;
  int local_4dc;
  undefined8 local_4d8;
  uint local_4d0;
  uint uStack_4cc;
  uint local_4c8;
  undefined1 local_4c4 [4];
  undefined1 local_4c0 [4];
  undefined1 local_4bc [92];
  REF_GRID_conflict local_460;
  REF_DBL local_458;
  REF_DBL local_450;
  REF_NODE local_448;
  REF_DBL local_440;
  char local_438 [1032];
  
  uVar2 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar2 == 0) {
    pRVar13 = *ref_grid_ptr;
    local_448 = pRVar13->node;
    __stream = fopen(filename,"r");
    if (__stream != (FILE *)0x0) {
      local_4e0 = 0xffffffff;
      do {
        do {
          iVar3 = feof(__stream);
          if (iVar3 != 0) {
            fclose(__stream);
            return 0;
          }
          pcVar11 = fgets(local_438,0x400,__stream);
          if (local_438 != pcVar11) {
            return 0;
          }
          pcVar11 = strchr(local_438,0x3d);
        } while (pcVar11 == (char *)0x0);
        pcVar6 = strstr(local_438,"NDIME");
        if (pcVar6 != (char *)0x0) {
          uVar2 = atoi(pcVar11 + 1);
          printf("NDIME %d\n",(ulong)uVar2);
          local_4e0 = uVar2;
          if (uVar2 == 2) {
            pRVar13->twod = 1;
            local_4e0 = 2;
          }
        }
        local_460 = pRVar13;
        pcVar6 = strstr(local_438,"NPOIN");
        if (pcVar6 != (char *)0x0) {
          uVar4 = atoi(pcVar11 + 1);
          printf("NPOIN %d\n",(ulong)uVar4);
          ref_node = local_448;
          local_4e4 = uVar4;
          if (0 < (int)uVar4) {
            uVar10 = 0;
            do {
              pcVar6 = fgets(local_438,0x400,__stream);
              if (local_438 != pcVar6) {
                pcVar11 = "unable to read point xyz line";
                uVar9 = 0x345;
                goto LAB_0016e704;
              }
              if (local_4e0 == 2) {
                iVar3 = __isoc99_sscanf(local_438,"%lf %lf",&local_450,&local_458);
                if (iVar3 != 2) {
                  lVar7 = (long)iVar3;
                  pcVar11 = "parse xyz";
                  uVar12 = 2;
                  uVar9 = 0x347;
                  goto LAB_0016e831;
                }
                uVar2 = ref_node_add(ref_node,uVar10,&local_4dc);
                if (uVar2 != 0) {
                  pcVar11 = "add node";
                  uVar9 = 0x348;
                  goto LAB_0016da9f;
                }
                pRVar1 = ref_node->real;
                lVar7 = (long)local_4dc;
                pRVar8 = pRVar1 + lVar7 * 0xf;
                pRVar1[lVar7 * 0xf] = local_450;
                pRVar1[lVar7 * 0xf + 1] = local_458;
                RVar14 = 0.0;
              }
              else {
                iVar3 = __isoc99_sscanf(local_438,"%lf %lf %lf",&local_450,&local_458,&local_440);
                if (iVar3 != 3) {
                  lVar7 = (long)iVar3;
                  pcVar11 = "parse xyz";
                  uVar12 = 3;
                  uVar9 = 0x34d;
                  goto LAB_0016e831;
                }
                uVar2 = ref_node_add(ref_node,uVar10,&local_4dc);
                if (uVar2 != 0) {
                  pcVar11 = "add node";
                  uVar9 = 0x34e;
                  goto LAB_0016da9f;
                }
                pRVar1 = ref_node->real;
                lVar7 = (long)local_4dc;
                pRVar8 = pRVar1 + lVar7 * 0xf;
                pRVar1[lVar7 * 0xf] = local_450;
                pRVar1[lVar7 * 0xf + 1] = local_458;
                RVar14 = local_440;
              }
              pRVar8[2] = RVar14;
              uVar10 = uVar10 + 1;
            } while (uVar4 != uVar10);
          }
          uVar2 = ref_node_initialize_n_global(ref_node,(long)(int)local_4e4);
          if (uVar2 != 0) {
            pcVar11 = "init glob";
            uVar9 = 0x354;
            goto LAB_0016da9f;
          }
        }
        pcVar6 = strstr(local_438,"NELEM");
        if (pcVar6 != (char *)0x0) {
          uVar4 = atoi(pcVar11 + 1);
          printf("NELEM %d\n",(ulong)uVar4);
          if (0 < (int)uVar4) {
            do {
              pcVar6 = fgets(local_438,0x400,__stream);
              if (local_438 != pcVar6) {
                pcVar11 = "unable to read element line";
                uVar9 = 0x35a;
                goto LAB_0016e704;
              }
              iVar3 = __isoc99_sscanf(local_438,"%d",&local_4ec);
              pRVar13 = local_460;
              if (iVar3 != 1) {
                lVar7 = (long)iVar3;
                pcVar11 = "parse element type";
                uVar12 = 1;
                uVar9 = 0x35b;
LAB_0016e831:
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,uVar9,"ref_import_su2",pcVar11,uVar12,lVar7);
                return 1;
              }
              switch(local_4ec) {
              case 5:
                iVar3 = __isoc99_sscanf(local_438,"%d %d %d %d",&local_4ec,&local_4d8,
                                        (long)&local_4d8 + 4,&local_4d0);
                if (iVar3 != 4) {
                  lVar7 = (long)iVar3;
                  pcVar11 = "parse marker element";
                  uVar12 = 4;
                  uVar9 = 0x381;
                  goto LAB_0016e831;
                }
                uStack_4cc = 0;
                uVar2 = ref_cell_add(pRVar13->cell[3],(REF_INT *)&local_4d8,&local_4e8);
                if (uVar2 != 0) {
                  pcVar11 = "tri";
                  uVar9 = 899;
                  goto LAB_0016da9f;
                }
                break;
              default:
                printf("cell_type = %d\n");
                pcVar11 = "unknown SU2/VTK ELEM type";
                uVar9 = 0x390;
                goto LAB_0016e704;
              case 9:
                iVar3 = __isoc99_sscanf(local_438,"%d %d %d %d %d",&local_4ec,&local_4d8,
                                        (long)&local_4d8 + 4,&local_4d0,&uStack_4cc);
                if (iVar3 != 5) {
                  lVar7 = (long)iVar3;
                  pcVar11 = "parse marker element";
                  uVar12 = 5;
                  uVar9 = 0x389;
                  goto LAB_0016e831;
                }
                local_4c8 = 0;
                uVar2 = ref_cell_add(pRVar13->cell[6],(REF_INT *)&local_4d8,&local_4e8);
                if (uVar2 != 0) {
                  pcVar11 = "tri";
                  uVar9 = 0x38b;
                  goto LAB_0016da9f;
                }
                break;
              case 10:
                iVar3 = __isoc99_sscanf(local_438,"%d %d %d %d %d",&local_4ec,&local_4d8,
                                        (long)&local_4d8 + 4,&local_4d0,&uStack_4cc);
                if (iVar3 != 5) {
                  lVar7 = (long)iVar3;
                  pcVar11 = "parse element";
                  uVar12 = 5;
                  uVar9 = 0x361;
                  goto LAB_0016e831;
                }
                uVar2 = ref_cell_add(pRVar13->cell[8],(REF_INT *)&local_4d8,&local_4e8);
                if (uVar2 != 0) {
                  pcVar11 = "tet";
                  uVar9 = 0x362;
                  goto LAB_0016da9f;
                }
                break;
              case 0xc:
                iVar3 = __isoc99_sscanf(local_438,"%d %d %d %d %d %d %d %d %d",&local_4ec,&local_4d8
                                        ,(long)&local_4d8 + 4,&local_4d0,&uStack_4cc,&local_4c8,
                                        local_4c4,local_4c0,local_4bc);
                if (iVar3 != 9) {
                  lVar7 = (long)iVar3;
                  pcVar11 = "parse element";
                  uVar12 = 9;
                  uVar9 = 0x37a;
                  goto LAB_0016e831;
                }
                uVar2 = ref_cell_add(pRVar13->cell[0xb],(REF_INT *)&local_4d8,&local_4e8);
                if (uVar2 != 0) {
                  pcVar11 = "tri";
                  uVar9 = 0x37b;
                  goto LAB_0016da9f;
                }
                break;
              case 0xd:
                iVar3 = __isoc99_sscanf(local_438,"%d %d %d %d %d %d %d",&local_4ec,&local_4d8,
                                        (long)&local_4d8 + 4,&local_4d0,&uStack_4cc,&local_4c8,
                                        local_4c4);
                uVar2 = uStack_4cc;
                if (iVar3 != 7) {
                  lVar7 = (long)iVar3;
                  pcVar11 = "parse element";
                  uVar12 = 7;
                  uVar9 = 0x371;
                  goto LAB_0016e831;
                }
                local_4d8 = CONCAT44((int)local_4d8,(int)((ulong)local_4d8 >> 0x20));
                uStack_4cc = local_4c8;
                local_4c8 = uVar2;
                uVar2 = ref_cell_add(pRVar13->cell[10],(REF_INT *)&local_4d8,&local_4e8);
                if (uVar2 != 0) {
                  pcVar11 = "tri";
                  uVar9 = 0x373;
                  goto LAB_0016da9f;
                }
                break;
              case 0xe:
                iVar3 = __isoc99_sscanf(local_438,"%d %d %d %d %d %d",&local_4ec,&local_4d8,
                                        (long)&local_4d8 + 4,&local_4d0,&uStack_4cc,&local_4c8);
                uVar5 = uStack_4cc;
                uVar2 = local_4d0;
                if (iVar3 != 6) {
                  lVar7 = (long)iVar3;
                  pcVar11 = "parse element";
                  uVar12 = 6;
                  uVar9 = 0x368;
                  goto LAB_0016e831;
                }
                local_4d8 = CONCAT44((int)local_4d8,(int)((ulong)local_4d8 >> 0x20));
                local_4d0 = local_4c8;
                uStack_4cc = uVar2;
                local_4c8 = uVar5;
                uVar2 = ref_cell_add(pRVar13->cell[9],(REF_INT *)&local_4d8,&local_4e8);
                if (uVar2 != 0) {
                  pcVar11 = "pyr";
                  uVar9 = 0x36a;
                  goto LAB_0016da9f;
                }
              }
              uVar4 = uVar4 - 1;
            } while (uVar4 != 0);
          }
        }
        pcVar6 = strstr(local_438,"NMARK");
        pRVar13 = local_460;
        if (pcVar6 != (char *)0x0) {
          uVar2 = atoi(pcVar11 + 1);
          printf("NMARK %d\n",(ulong)uVar2);
          local_4e4 = uVar2;
          if (0 < (int)uVar2) {
            uVar10 = 1;
            do {
              pcVar11 = fgets(local_438,0x400,__stream);
              if (local_438 != pcVar11) {
                pcVar11 = "unable to read marker tag";
                uVar9 = 0x398;
                goto LAB_0016e704;
              }
              uVar4 = (uint)uVar10;
              printf("%d: %s",uVar10,local_438);
              pcVar11 = strstr(local_438,"MARKER_TAG");
              if (pcVar11 == (char *)0x0) {
                pcVar11 = "MARKER_TAG not found";
                uVar9 = 0x39a;
LAB_0016e704:
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,uVar9,"ref_import_su2",pcVar11);
                return 1;
              }
              pcVar11 = fgets(local_438,0x400,__stream);
              if (local_438 != pcVar11) {
                pcVar11 = "unable to read marker elems";
                uVar9 = 0x39b;
                goto LAB_0016e704;
              }
              pcVar11 = strstr(local_438,"MARKER_ELEMS");
              if (pcVar11 == (char *)0x0) {
                pcVar11 = "MARKER_ELEMS not found";
                uVar9 = 0x39c;
                goto LAB_0016e704;
              }
              pcVar11 = strchr(local_438,0x3d);
              if (pcVar11 == (char *)0x0) {
                pcVar11 = "MARKER_ELEMS missing =";
                uVar9 = 0x39e;
                goto LAB_0016e31d;
              }
              uVar5 = atoi(pcVar11 + 1);
              printf("%d: %s",(ulong)uVar5,local_438);
              if (0 < (int)uVar5) {
                do {
                  pcVar11 = fgets(local_438,0x400,__stream);
                  if (local_438 != pcVar11) {
                    pcVar11 = "unable to read marker line";
                    uVar9 = 0x3a2;
                    goto LAB_0016e704;
                  }
                  iVar3 = __isoc99_sscanf(local_438,"%d",&local_4ec);
                  if (iVar3 != 1) {
                    lVar7 = (long)iVar3;
                    pcVar11 = "parse marker element type";
                    uVar12 = 1;
                    uVar9 = 0x3a3;
                    goto LAB_0016e831;
                  }
                  if (local_4ec == 3) {
                    iVar3 = __isoc99_sscanf(local_438,"%d %d %d",&local_4ec,&local_4d8,
                                            (long)&local_4d8 + 4);
                    if (iVar3 != 3) {
                      lVar7 = (long)iVar3;
                      pcVar11 = "parse marker element";
                      uVar12 = 3;
                      uVar9 = 0x3bb;
                      goto LAB_0016e831;
                    }
                    local_4d0 = uVar4;
                    uVar2 = ref_cell_add(pRVar13->cell[0],(REF_INT *)&local_4d8,&local_4e8);
                    if (uVar2 != 0) {
                      pcVar11 = "edg";
                      uVar9 = 0x3be;
                      goto LAB_0016da9f;
                    }
                  }
                  else if (local_4ec == 9) {
                    iVar3 = __isoc99_sscanf(local_438,"%d %d %d %d %d",&local_4ec,&local_4d8,
                                            (long)&local_4d8 + 4,&local_4d0,&uStack_4cc);
                    if (iVar3 != 5) {
                      lVar7 = (long)iVar3;
                      pcVar11 = "parse marker element";
                      uVar12 = 5;
                      uVar9 = 0x3b2;
                      goto LAB_0016e831;
                    }
                    local_4c8 = uVar4;
                    uVar2 = ref_cell_add(pRVar13->cell[6],(REF_INT *)&local_4d8,&local_4e8);
                    if (uVar2 != 0) {
                      pcVar11 = "tri";
                      uVar9 = 0x3b5;
                      goto LAB_0016da9f;
                    }
                  }
                  else {
                    if (local_4ec != 5) {
                      printf("cell_type = %d\n");
                      pcVar11 = "unknown SU2/VTK MARKER ELEM type";
                      uVar9 = 0x3c2;
                      goto LAB_0016e704;
                    }
                    iVar3 = __isoc99_sscanf(local_438,"%d %d %d %d",&local_4ec,&local_4d8,
                                            (long)&local_4d8 + 4,&local_4d0);
                    if (iVar3 != 4) {
                      lVar7 = (long)iVar3;
                      pcVar11 = "parse marker element";
                      uVar12 = 4;
                      uVar9 = 0x3a9;
                      goto LAB_0016e831;
                    }
                    uStack_4cc = uVar4;
                    uVar2 = ref_cell_add(pRVar13->cell[3],(REF_INT *)&local_4d8,&local_4e8);
                    if (uVar2 != 0) {
                      pcVar11 = "tri";
                      uVar9 = 0x3ac;
                      goto LAB_0016da9f;
                    }
                  }
                  uVar5 = uVar5 - 1;
                  pRVar13 = local_460;
                } while (uVar5 != 0);
              }
              uVar10 = (ulong)(uVar4 + 1);
            } while (uVar4 != local_4e4);
          }
        }
      } while( true );
    }
    printf("unable to open %s\n",filename);
    pcVar11 = "unable to open file";
    uVar9 = 0x333;
LAB_0016e31d:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar9,
           "ref_import_su2",pcVar11);
    uVar2 = 2;
  }
  else {
    pcVar11 = "create grid";
    uVar9 = 0x32d;
LAB_0016da9f:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar9,
           "ref_import_su2",(ulong)uVar2,pcVar11);
  }
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_import_su2(REF_GRID *ref_grid_ptr,
                                         REF_MPI ref_mpi,
                                         const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  FILE *file;
  char line[1024];
  char *location;
  REF_INT ndime, npoin, nelem, nmark;
  REF_DBL x, y, z;
  REF_INT node, new_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER], ncell, cell, new_cell, cell_type;
  REF_INT faceid;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  ndime = -1;
  while (!feof(file)) {
    if (line != fgets(line, 1024, file)) return REF_SUCCESS;
    location = strchr(line, '=');
    if (NULL == location) continue;
    if (NULL != strstr(line, "NDIME")) {
      ndime = atoi(location + 1);
      printf("NDIME %d\n", ndime);
      if (2 == ndime) {
        ref_grid_twod(ref_grid) = REF_TRUE;
      }
    }
    if (NULL != strstr(line, "NPOIN")) {
      npoin = atoi(location + 1);
      printf("NPOIN %d\n", npoin);
      for (node = 0; node < npoin; node++) {
        RAS(line == fgets(line, 1024, file), "unable to read point xyz line");
        if (2 == ndime) {
          REIS(2, sscanf(line, "%lf %lf", &x, &y), "parse xyz");
          RSS(ref_node_add(ref_node, node, &new_node), "add node");
          ref_node_xyz(ref_node, 0, new_node) = x;
          ref_node_xyz(ref_node, 1, new_node) = y;
          ref_node_xyz(ref_node, 2, new_node) = 0.0;
        } else {
          REIS(3, sscanf(line, "%lf %lf %lf", &x, &y, &z), "parse xyz");
          RSS(ref_node_add(ref_node, node, &new_node), "add node");
          ref_node_xyz(ref_node, 0, new_node) = x;
          ref_node_xyz(ref_node, 1, new_node) = y;
          ref_node_xyz(ref_node, 2, new_node) = z;
        }
      }
      RSS(ref_node_initialize_n_global(ref_node, npoin), "init glob");
    }
    if (NULL != strstr(line, "NELEM")) {
      nelem = atoi(location + 1);
      printf("NELEM %d\n", nelem);
      for (cell = 0; cell < nelem; cell++) {
        RAS(line == fgets(line, 1024, file), "unable to read element line");
        REIS(1, sscanf(line, "%d", &cell_type), "parse element type");
        switch (cell_type) {
          case VTK_TETRA:
            REIS(5,
                 sscanf(line, "%d %d %d %d %d", &cell_type, &(nodes[0]),
                        &(nodes[1]), &(nodes[2]), &(nodes[3])),
                 "parse element");
            RSS(ref_cell_add(ref_grid_tet(ref_grid), nodes, &new_cell), "tet");
            break;
          case VTK_PYRAMID:
            REIS(6,
                 sscanf(line, "%d %d %d %d %d %d", &cell_type, &(nodes[0]),
                        &(nodes[1]), &(nodes[2]), &(nodes[3]), &(nodes[4])),
                 "parse element");
            VTK_PYRAMID_TO_UGRID(nodes);
            RSS(ref_cell_add(ref_grid_pyr(ref_grid), nodes, &new_cell), "pyr");
            break;
          case VTK_WEDGE:
            REIS(7,
                 sscanf(line, "%d %d %d %d %d %d %d", &cell_type, &(nodes[0]),
                        &(nodes[1]), &(nodes[2]), &(nodes[3]), &(nodes[4]),
                        &(nodes[5])),
                 "parse element");
            VTK_WEDGE_TO_UGRID(nodes);
            RSS(ref_cell_add(ref_grid_pri(ref_grid), nodes, &new_cell), "tri");
            break;
          case VTK_HEXAHEDRON:
            REIS(9,
                 sscanf(line, "%d %d %d %d %d %d %d %d %d", &cell_type,
                        &(nodes[0]), &(nodes[1]), &(nodes[2]), &(nodes[3]),
                        &(nodes[4]), &(nodes[5]), &(nodes[6]), &(nodes[7])),
                 "parse element");
            RSS(ref_cell_add(ref_grid_hex(ref_grid), nodes, &new_cell), "tri");
            break;
          case VTK_TRIANGLE:
            REIS(4,
                 sscanf(line, "%d %d %d %d", &cell_type, &(nodes[0]),
                        &(nodes[1]), &(nodes[2])),
                 "parse marker element");
            nodes[3] = 0;
            RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &new_cell), "tri");
            break;
          case VTK_QUAD:
            REIS(5,
                 sscanf(line, "%d %d %d %d %d", &cell_type, &(nodes[0]),
                        &(nodes[1]), &(nodes[2]), &(nodes[3])),
                 "parse marker element");
            nodes[4] = 0;
            RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &new_cell), "tri");
            break;

          default:
            printf("cell_type = %d\n", cell_type);
            THROW("unknown SU2/VTK ELEM type");
        }
      }
    }
    if (NULL != strstr(line, "NMARK")) {
      nmark = atoi(location + 1);
      printf("NMARK %d\n", nmark);
      for (faceid = 1; faceid <= nmark; faceid++) {
        RAS(line == fgets(line, 1024, file), "unable to read marker tag");
        printf("%d: %s", faceid, line);
        RAS(NULL != strstr(line, "MARKER_TAG"), "MARKER_TAG not found");
        RAS(line == fgets(line, 1024, file), "unable to read marker elems");
        RAS(NULL != strstr(line, "MARKER_ELEMS"), "MARKER_ELEMS not found");
        location = strchr(line, '=');
        RNS(location, "MARKER_ELEMS missing =");
        ncell = atoi(location + 1);
        printf("%d: %s", ncell, line);
        for (cell = 0; cell < ncell; cell++) {
          RAS(line == fgets(line, 1024, file), "unable to read marker line");
          REIS(1, sscanf(line, "%d", &cell_type), "parse marker element type");
          switch (cell_type) {
            case VTK_TRIANGLE:
              REIS(4,
                   sscanf(line, "%d %d %d %d", &cell_type, &(nodes[0]),
                          &(nodes[1]), &(nodes[2])),
                   "parse marker element");
              nodes[3] = faceid;
              RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &new_cell),
                  "tri");
              break;
            case VTK_QUAD:
              REIS(5,
                   sscanf(line, "%d %d %d %d %d", &cell_type, &(nodes[0]),
                          &(nodes[1]), &(nodes[2]), &(nodes[3])),
                   "parse marker element");
              nodes[4] = faceid;
              RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &new_cell),
                  "tri");
              break;
            case VTK_LINE:
              REIS(3,
                   sscanf(line, "%d %d %d", &cell_type, &(nodes[0]),
                          &(nodes[1])),
                   "parse marker element");
              nodes[2] = faceid;
              RSS(ref_cell_add(ref_grid_edg(ref_grid), nodes, &new_cell),
                  "edg");
              break;
            default:
              printf("cell_type = %d\n", cell_type);
              THROW("unknown SU2/VTK MARKER ELEM type");
          }
        }
      }
    }
  }

  fclose(file);

  return REF_SUCCESS;
}